

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

reverse_iterator * __thiscall
immutable::transient_vector<int,_true,_5>::rend
          (reverse_iterator *__return_storage_ptr__,transient_vector<int,_true,_5> *this)

{
  transient_rrb<int,_true,_5> *ptVar1;
  ref<immutable::transient_rrb<int,_true,_5>_> local_40;
  ref<immutable::transient_rrb<int,_true,_5>_> local_38;
  undefined4 local_30;
  undefined4 uStack_2c;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> _Stack_28;
  int *local_20;
  
  ptVar1 = (this->_impl).ptr;
  if (ptVar1 != (transient_rrb<int,_true,_5> *)0x0) {
    LOCK();
    (ptVar1->_ref_count).super___atomic_base<unsigned_int>._M_i =
         (ptVar1->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    LOCK();
    (ptVar1->_ref_count).super___atomic_base<unsigned_int>._M_i =
         (ptVar1->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
  }
  local_30 = 0;
  _Stack_28.super__Tuple_impl<2UL,_unsigned_int>.super__Head_base<2UL,_unsigned_int,_false>.
  _M_head_impl = (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
  _Stack_28.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0xffffffff;
  local_20 = (int *)0x0;
  local_40.ptr = ptVar1;
  local_38.ptr = ptVar1;
  ref<immutable::rrb<int,_true,_5>_>::~ref((ref<immutable::rrb<int,_true,_5>_> *)&local_40);
  (__return_storage_ptr__->current)._impl.ptr = (rrb<int,_true,_5> *)ptVar1;
  if (ptVar1 != (transient_rrb<int,_true,_5> *)0x0) {
    LOCK();
    (ptVar1->_ref_count).super___atomic_base<unsigned_int>._M_i =
         (ptVar1->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
  }
  (__return_storage_ptr__->current)._cursor.
  super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
  super__Head_base<0UL,_const_int_*,_false>._M_head_impl = local_20;
  *(ulong *)&(__return_storage_ptr__->current)._index = CONCAT44(uStack_2c,local_30);
  (__return_storage_ptr__->current)._cursor.
  super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
  super__Tuple_impl<1UL,_unsigned_int,_unsigned_int> = _Stack_28;
  ref<immutable::rrb<int,_true,_5>_>::~ref((ref<immutable::rrb<int,_true,_5>_> *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

reverse_iterator rend() const
        {
        return reverse_iterator{ begin() };
        }